

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_buffer.h
# Opt level: O0

CordRep * __thiscall
absl::lts_20240722::CordBuffer::ConsumeValue(CordBuffer *this,string_view *short_value)

{
  bool bVar1;
  char *__str;
  size_t __len;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  CordRep *local_20;
  CordRep *rep;
  string_view *short_value_local;
  CordBuffer *this_local;
  
  local_20 = (CordRep *)0x0;
  rep = (CordRep *)short_value;
  short_value_local = (string_view *)this;
  bVar1 = Rep::is_short(&this->rep_);
  if (bVar1) {
    __str = Rep::data(&this->rep_);
    __len = Rep::short_length(&this->rep_);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,__str,__len);
    rep->length = local_30._M_len;
    *(char **)&rep->refcount = local_30._M_str;
  }
  else {
    local_20 = &Rep::rep(&this->rep_)->super_CordRep;
  }
  Rep::set_short_length(&this->rep_,0);
  return local_20;
}

Assistant:

cord_internal::CordRep* ConsumeValue(absl::string_view& short_value) {
    cord_internal::CordRep* rep = nullptr;
    if (rep_.is_short()) {
      short_value = absl::string_view(rep_.data(), rep_.short_length());
    } else {
      rep = rep_.rep();
    }
    rep_.set_short_length(0);
    return rep;
  }